

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

int cs_impl::math_cs_ext::rand(void)

{
  longdouble *in_RDX;
  random_device *in_RSI;
  longdouble *in_RDI;
  longdouble in_ST0;
  longdouble lVar1;
  longdouble lVar2;
  
  lVar1 = *(longdouble *)&in_RSI->field_0;
  if ((in_RSI->field_0).field2[0x10] != '\0') {
    lVar1 = (longdouble)(long)(in_RSI->field_0).field_0._M_file;
  }
  lVar2 = *in_RDX;
  if (*(char *)(in_RDX + 1) != '\0') {
    lVar2 = (longdouble)*(long *)in_RDX;
  }
  std::generate_canonical<long_double,64ul,std::random_device>
            ((longdouble *)cov::random::random_engine,in_RSI);
  *(undefined1 *)(in_RDI + 1) = 0;
  *in_RDI = lVar1 + (lVar2 - lVar1) * in_ST0;
  return (int)in_RDI;
}

Assistant:

numeric rand(const numeric& b, const numeric& e)
		{
			return cov::rand<numeric_float>(b.as_float(), e.as_float());
		}